

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBoxPrivate::initViewItemOption(QComboBoxPrivate *this,QStyleOptionViewItem *option)

{
  QComboBox *pQVar1;
  QAbstractItemView *pQVar2;
  long in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QString *other;
  QComboBox *in_stack_ffffffffffffff70;
  QPersistentModelIndex *this_00;
  QModelIndex *index;
  QComboBox *in_stack_ffffffffffffff88;
  QComboBoxPrivate *this_01;
  QModelIndex local_58;
  undefined1 local_40 [32];
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  pQVar2 = QComboBox::view(in_stack_ffffffffffffff70);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2f8))
            (pQVar2,in_RSI);
  *(QComboBox **)(in_RSI + 0x78) = pQVar1;
  this_00 = &in_RDI->currentIndex;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
  *(QPersistentModelIndexData **)(in_RSI + 0x90) = local_20[2].d;
  *(QPersistentModelIndexData **)(in_RSI + 0x80) = local_20[0].d;
  *(QPersistentModelIndexData **)(in_RSI + 0x88) = local_20[1].d;
  other = (QString *)(local_40 + 8);
  QComboBox::currentText(in_stack_ffffffffffffff88);
  QString::operator=((QString *)this_00,other);
  QString::~QString((QString *)0x532882);
  index = &local_58;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)index);
  this_01 = (QComboBoxPrivate *)local_40;
  itemIcon(this_01,index);
  QIcon::operator=((QIcon *)index,(QIcon *)in_RDI);
  QIcon::~QIcon((QIcon *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::initViewItemOption(QStyleOptionViewItem *option) const
{
    Q_Q(const QComboBox);
    q->view()->initViewItemOption(option);
    option->widget = q;
    option->index = currentIndex;
    option->text = q->currentText();
    option->icon = itemIcon(currentIndex);
}